

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

QString * __thiscall
QUrlPrivate::toLocalFile
          (QString *__return_storage_ptr__,QUrlPrivate *this,FormattingOptions options)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_const_QString_&> local_70;
  QString local_58;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  appendPath(this,&local_38,options,Path);
  if ((this->host).d.size == 0) {
    QString::operator=(__return_storage_ptr__,&local_38);
  }
  else {
    local_70.b = &this->host;
    local_70.a.m_size = 2;
    local_70.a.m_data = "//";
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>(&local_58,&local_70);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.d = (Data *)data;
    local_58.d.ptr = pcVar1;
    local_58.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (local_38.d.size != 0) {
      bVar3 = QString::startsWith(&local_38,(QChar)0x2f,CaseSensitive);
      if (!bVar3) {
        QString::append(__return_storage_ptr__,(QChar)0x2f);
      }
    }
    QString::append(__return_storage_ptr__,&local_38);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlPrivate::toLocalFile(QUrl::FormattingOptions options) const
{
    QString tmp;
    QString ourPath;
    appendPath(ourPath, options, QUrlPrivate::Path);

    // magic for shared drive on windows
    if (!host.isEmpty()) {
        tmp = "//"_L1 + host;
#ifdef Q_OS_WIN // QTBUG-42346, WebDAV is visible as local file on Windows only.
        if (scheme == webDavScheme())
            tmp += webDavSslTag();
#endif
        if (!ourPath.isEmpty() && !ourPath.startsWith(u'/'))
            tmp += u'/';
        tmp += ourPath;
    } else {
        tmp = ourPath;
#ifdef Q_OS_WIN
        // magic for drives on windows
        if (ourPath.length() > 2 && ourPath.at(0) == u'/' && ourPath.at(2) == u':')
            tmp.remove(0, 1);
#endif
    }
    return tmp;
}